

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

void uv__signal_block_and_lock(sigset_t *saved_sigmask)

{
  int iVar1;
  __sigset_t *in_RDI;
  sigset_t new_mask;
  sigset_t sStack_88;
  __sigset_t *local_8;
  
  local_8 = in_RDI;
  iVar1 = sigfillset(&sStack_88);
  if (iVar1 != 0) {
    abort();
  }
  iVar1 = pthread_sigmask(2,&sStack_88,local_8);
  if (iVar1 != 0) {
    abort();
  }
  iVar1 = uv__signal_lock();
  if (iVar1 != 0) {
    abort();
  }
  return;
}

Assistant:

static void uv__signal_block_and_lock(sigset_t* saved_sigmask) {
  sigset_t new_mask;

  if (sigfillset(&new_mask))
    abort();

  if (pthread_sigmask(SIG_SETMASK, &new_mask, saved_sigmask))
    abort();

  if (uv__signal_lock())
    abort();
}